

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portal.cpp
# Opt level: O0

bool P_ChangePortal(line_t_conflict *ln,int thisid,int destid)

{
  bool bVar1;
  bool res;
  FLineIdIterator it;
  int lineno;
  int destid_local;
  int thisid_local;
  line_t_conflict *ln_local;
  
  it.start = destid;
  if (thisid == 0) {
    ln_local._7_1_ = ChangePortalLine(ln,destid);
  }
  else {
    FLineIdIterator::FLineIdIterator((FLineIdIterator *)&stack0xffffffffffffffd4,thisid);
    ln_local._7_1_ = false;
    while (it.searchtag = FLineIdIterator::Next((FLineIdIterator *)&stack0xffffffffffffffd4),
          -1 < it.searchtag) {
      bVar1 = ChangePortalLine(lines + it.searchtag,it.start);
      ln_local._7_1_ = ln_local._7_1_ != false || bVar1;
    }
  }
  return ln_local._7_1_;
}

Assistant:

bool P_ChangePortal(line_t *ln, int thisid, int destid)
{
	int lineno;

	if (thisid == 0) return ChangePortalLine(ln, destid);
	FLineIdIterator it(thisid);
	bool res = false;
	while ((lineno = it.Next()) >= 0)
	{
		res |= ChangePortalLine(&lines[lineno], destid);
	}
	return res;
}